

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-interpreter.h
# Opt level: O0

Flow * __thiscall
wasm::ModuleRunnerBase<wasm::ModuleRunner>::visitAtomicRMW
          (Flow *__return_storage_ptr__,ModuleRunnerBase<wasm::ModuleRunner> *this,AtomicRMW *curr)

{
  byte bVar1;
  Name memoryName;
  Name memoryName_00;
  Name memory;
  undefined1 this_00 [8];
  char *curr_00;
  bool bVar2;
  ExpressionRunner<wasm::ModuleRunner> *pEVar3;
  Address memorySize_00;
  Literal *pLVar4;
  Literal local_258;
  address64_t local_240;
  ModuleRunner *local_238;
  size_t sStack_230;
  Literal local_220;
  Address local_208;
  Literal local_200;
  Literal local_1e8;
  Literal local_1d0;
  Literal local_1b8;
  Literal local_1a0;
  undefined1 local_188 [8];
  Literal computed;
  undefined1 local_148 [8];
  Literal loaded;
  Literal local_128;
  Address local_110;
  Address addr;
  Address memorySize;
  undefined1 local_d8 [8];
  MemoryInstanceInfo info;
  Flow value;
  undefined1 local_68 [8];
  Flow ptr;
  AtomicRMW *curr_local;
  ModuleRunnerBase<wasm::ModuleRunner> *this_local;
  
  ptr.breakTo.super_IString.str._M_str = (char *)curr;
  pEVar3 = (ExpressionRunner<wasm::ModuleRunner> *)self(this);
  ExpressionRunner<wasm::ModuleRunner>::visit
            ((Flow *)local_68,pEVar3,*(Expression **)(ptr.breakTo.super_IString.str._M_str + 0x20));
  bVar2 = Flow::breaking((Flow *)local_68);
  if (bVar2) {
    Flow::Flow(__return_storage_ptr__,(Flow *)local_68);
  }
  else {
    pEVar3 = (ExpressionRunner<wasm::ModuleRunner> *)self(this);
    ExpressionRunner<wasm::ModuleRunner>::visit
              ((Flow *)&info.name.super_IString.str._M_str,pEVar3,
               *(Expression **)(ptr.breakTo.super_IString.str._M_str + 0x28));
    bVar2 = Flow::breaking((Flow *)&info.name.super_IString.str._M_str);
    if (bVar2) {
      Flow::Flow(__return_storage_ptr__,(Flow *)&info.name.super_IString.str._M_str);
    }
    else {
      getMemoryInstanceInfo
                ((MemoryInstanceInfo *)local_d8,this,
                 (Name)((IString *)(ptr.breakTo.super_IString.str._M_str + 0x30))->str);
      addr.addr = (address64_t)info.instance;
      memory.super_IString.str._M_str = (char *)info.name.super_IString.str._M_len;
      memory.super_IString.str._M_len = (size_t)info.instance;
      memorySize_00 = getMemorySize((ModuleRunnerBase<wasm::ModuleRunner> *)local_d8,memory);
      curr_00 = ptr.breakTo.super_IString.str._M_str;
      this_00 = local_d8;
      pLVar4 = Flow::getSingleValue((Flow *)local_68);
      ::wasm::Literal::Literal(&local_128,pLVar4);
      loaded.type.id = (uintptr_t)memorySize_00;
      local_110 = getFinalAddress<wasm::AtomicRMW>
                            ((ModuleRunnerBase<wasm::ModuleRunner> *)this_00,(AtomicRMW *)curr_00,
                             &local_128,memorySize_00);
      ::wasm::Literal::~Literal(&local_128);
      memoryName.super_IString.str._M_str = (char *)info.name.super_IString.str._M_len;
      memoryName.super_IString.str._M_len = (size_t)info.instance;
      computed.type.id = (uintptr_t)memorySize_00;
      doAtomicLoad((Literal *)local_148,(ModuleRunnerBase<wasm::ModuleRunner> *)local_d8,local_110,
                   (uint)(byte)ptr.breakTo.super_IString.str._M_str[0x14],
                   (Type)*(uintptr_t *)(ptr.breakTo.super_IString.str._M_str + 8),memoryName,
                   memorySize_00);
      pLVar4 = Flow::getSingleValue((Flow *)&info.name.super_IString.str._M_str);
      ::wasm::Literal::Literal((Literal *)local_188,pLVar4);
      switch(*(undefined4 *)(ptr.breakTo.super_IString.str._M_str + 0x10)) {
      case 0:
        ::wasm::Literal::add(&local_1a0);
        ::wasm::Literal::operator=((Literal *)local_188,&local_1a0);
        ::wasm::Literal::~Literal(&local_1a0);
        break;
      case 1:
        ::wasm::Literal::sub(&local_1b8);
        ::wasm::Literal::operator=((Literal *)local_188,&local_1b8);
        ::wasm::Literal::~Literal(&local_1b8);
        break;
      case 2:
        ::wasm::Literal::and_(&local_1d0);
        ::wasm::Literal::operator=((Literal *)local_188,&local_1d0);
        ::wasm::Literal::~Literal(&local_1d0);
        break;
      case 3:
        ::wasm::Literal::or_(&local_1e8);
        ::wasm::Literal::operator=((Literal *)local_188,&local_1e8);
        ::wasm::Literal::~Literal(&local_1e8);
        break;
      case 4:
        ::wasm::Literal::xor_(&local_200);
        ::wasm::Literal::operator=((Literal *)local_188,&local_200);
        ::wasm::Literal::~Literal(&local_200);
        break;
      case 5:
      }
      local_208.addr = local_110.addr;
      bVar1 = ptr.breakTo.super_IString.str._M_str[0x14];
      ::wasm::Literal::Literal(&local_220,(Literal *)local_188);
      local_238 = info.instance;
      sStack_230 = info.name.super_IString.str._M_len;
      memoryName_00.super_IString.str._M_str = (char *)info.name.super_IString.str._M_len;
      memoryName_00.super_IString.str._M_len = (size_t)info.instance;
      local_240 = memorySize_00.addr;
      doAtomicStore((ModuleRunnerBase<wasm::ModuleRunner> *)local_d8,local_208,(uint)bVar1,
                    &local_220,memoryName_00,memorySize_00);
      ::wasm::Literal::~Literal(&local_220);
      ::wasm::Literal::Literal(&local_258,(Literal *)local_148);
      Flow::Flow(__return_storage_ptr__,&local_258);
      ::wasm::Literal::~Literal(&local_258);
      ::wasm::Literal::~Literal((Literal *)local_188);
      ::wasm::Literal::~Literal((Literal *)local_148);
    }
    Flow::~Flow((Flow *)&info.name.super_IString.str._M_str);
  }
  Flow::~Flow((Flow *)local_68);
  return __return_storage_ptr__;
}

Assistant:

Flow visitAtomicRMW(AtomicRMW* curr) {
    NOTE_ENTER("AtomicRMW");
    Flow ptr = self()->visit(curr->ptr);
    if (ptr.breaking()) {
      return ptr;
    }
    auto value = self()->visit(curr->value);
    if (value.breaking()) {
      return value;
    }
    NOTE_EVAL1(ptr);
    auto info = getMemoryInstanceInfo(curr->memory);
    auto memorySize = info.instance->getMemorySize(info.name);
    auto addr =
      info.instance->getFinalAddress(curr, ptr.getSingleValue(), memorySize);
    NOTE_EVAL1(addr);
    NOTE_EVAL1(value);
    auto loaded = info.instance->doAtomicLoad(
      addr, curr->bytes, curr->type, info.name, memorySize);
    NOTE_EVAL1(loaded);
    auto computed = value.getSingleValue();
    switch (curr->op) {
      case RMWAdd:
        computed = loaded.add(computed);
        break;
      case RMWSub:
        computed = loaded.sub(computed);
        break;
      case RMWAnd:
        computed = loaded.and_(computed);
        break;
      case RMWOr:
        computed = loaded.or_(computed);
        break;
      case RMWXor:
        computed = loaded.xor_(computed);
        break;
      case RMWXchg:
        break;
    }
    info.instance->doAtomicStore(
      addr, curr->bytes, computed, info.name, memorySize);
    return loaded;
  }